

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransportamqp_methods.c
# Opt level: O2

void on_message_sender_state_changed
               (void *context,MESSAGE_SENDER_STATE new_state,MESSAGE_SENDER_STATE previous_state)

{
  byte bVar1;
  int iVar2;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  code *UNRECOVERED_JUMPTABLE_00;
  undefined4 in_register_00000014;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uStack_8;
  
  uVar3 = CONCAT44(in_register_00000014,previous_state);
  if (context == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                 ,"on_message_sender_state_changed",0x19d,1,
                 "on_message_sender_state_changed called with NULL context");
      return;
    }
  }
  else if (new_state != previous_state) {
    iVar2 = *(int *)((long)context + 0x50);
    if (iVar2 == 3) {
      if (new_state != MESSAGE_SENDER_STATE_OPEN) {
LAB_001708c4:
        *(undefined4 *)((long)context + 0x50) = 4;
        (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
        return;
      }
    }
    else if (iVar2 == 2) {
      if ((new_state != MESSAGE_SENDER_STATE_IDLE) && (new_state != MESSAGE_SENDER_STATE_CLOSING))
      goto LAB_001708c4;
    }
    else if ((iVar2 == 1) && (new_state != MESSAGE_SENDER_STATE_OPENING)) {
      if (new_state == MESSAGE_SENDER_STATE_OPEN) {
        bVar1 = *(byte *)((long)context + 0x68);
        uVar3 = (ulong)bVar1 | 1;
        *(char *)((long)context + 0x68) = (char)uVar3;
        if ((bVar1 & 2) == 0) {
          return;
        }
        *(undefined4 *)((long)context + 0x50) = 3;
        UNRECOVERED_JUMPTABLE_00 = *(code **)((long)context + 0x30);
        uVar4 = *(undefined8 *)((long)context + 0x38);
        uStack_8 = 1;
      }
      else {
        *(undefined4 *)((long)context + 0x50) = 0;
        UNRECOVERED_JUMPTABLE_00 = *(code **)((long)context + 0x30);
        uVar4 = *(undefined8 *)((long)context + 0x38);
        uStack_8 = 2;
      }
      (*UNRECOVERED_JUMPTABLE_00)(uVar4,uStack_8,uVar3,UNRECOVERED_JUMPTABLE_00);
      return;
    }
  }
  return;
}

Assistant:

static void on_message_sender_state_changed(void* context, MESSAGE_SENDER_STATE new_state, MESSAGE_SENDER_STATE previous_state)
{
    IOTHUBTRANSPORT_AMQP_METHODS_HANDLE amqp_methods_handle = (IOTHUBTRANSPORT_AMQP_METHODS_HANDLE)context;
    if ((new_state != previous_state) &&
        (new_state == MESSAGE_SENDER_STATE_ERROR))
    {
        amqp_methods_handle->on_methods_error(amqp_methods_handle->on_methods_error_context);
    }
    else
    {
        if ((new_state == MESSAGE_SENDER_STATE_IDLE) && (previous_state == MESSAGE_SENDER_STATE_OPEN))
        {
            amqp_methods_handle->sender_link_disconnected = true;
        }
        call_methods_unsubscribed_if_needed(amqp_methods_handle);
    }
}